

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::SparsityStructure::addNonZero
          (SparsityStructure *this,size_t row,size_t col)

{
  size_t local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  string local_38;
  
  local_a8 = col;
  local_40 = row;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_nonZeroElementRows,&local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_nonZeroElementColumns,&local_a8);
  std::__cxx11::to_string(&local_38,local_40);
  std::operator+(&local_80,&local_38,"_");
  std::__cxx11::to_string(&local_a0,local_a8);
  std::operator+(&local_60,&local_80,&local_a0);
  std::__detail::
  _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void iDynTree::optimalcontrol::SparsityStructure::addNonZero(size_t row, size_t col)
{
    m_nonZeroElementRows.push_back(row);
    m_nonZeroElementColumns.push_back(col);
    m_register.insert(std::to_string(row) + "_" + std::to_string(col));
}